

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::emitInstance(SemanticParser *this,SP *pbrtInstance)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  element_type *peVar10;
  element_type *peVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  SP SVar12;
  SP *ourInstance;
  SP *in_stack_00000150;
  SemanticParser *in_stack_00000158;
  shared_ptr<pbrt::Object> *in_stack_ffffffffffffff78;
  
  std::make_shared<pbrt::Instance>();
  peVar10 = std::
            __shared_ptr_access<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d99e9);
  peVar11 = std::__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d99f8);
  fVar8 = (peVar10->xfm).atStart.l.vx.x;
  fVar9 = (peVar10->xfm).atStart.l.vx.y;
  uVar1 = *(undefined8 *)&(peVar10->xfm).atStart.l.vx.z;
  fVar4 = (peVar10->xfm).atStart.l.vy.y;
  fVar5 = (peVar10->xfm).atStart.l.vy.z;
  fVar6 = (peVar10->xfm).atStart.l.vz.x;
  fVar7 = (peVar10->xfm).atStart.l.vz.y;
  fVar2 = (peVar10->xfm).atStart.p.y;
  fVar3 = (peVar10->xfm).atStart.p.z;
  *(undefined8 *)&(peVar11->xfm).l.vz.z = *(undefined8 *)&(peVar10->xfm).atStart.l.vz.z;
  (peVar11->xfm).p.y = fVar2;
  (peVar11->xfm).p.z = fVar3;
  (peVar11->xfm).l.vy.y = fVar4;
  (peVar11->xfm).l.vy.z = fVar5;
  (peVar11->xfm).l.vz.x = fVar6;
  (peVar11->xfm).l.vz.y = fVar7;
  (peVar11->xfm).l.vx.x = fVar8;
  (peVar11->xfm).l.vx.y = fVar9;
  *(undefined8 *)&(peVar11->xfm).l.vx.z = uVar1;
  std::
  __shared_ptr_access<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1d9a1f);
  std::shared_ptr<pbrt::syntactic::Object>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Object> *)in_RDI,
             (shared_ptr<pbrt::syntactic::Object> *)in_stack_ffffffffffffff78);
  findOrEmitObject(in_stack_00000158,in_stack_00000150);
  std::__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1d9a51);
  std::shared_ptr<pbrt::Object>::operator=
            ((shared_ptr<pbrt::Object> *)in_RDI,in_stack_ffffffffffffff78);
  std::shared_ptr<pbrt::Object>::~shared_ptr((shared_ptr<pbrt::Object> *)0x1d9a6c);
  std::shared_ptr<pbrt::syntactic::Object>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Object> *)0x1d9a76);
  SVar12.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar12.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar12.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Instance::SP SemanticParser::emitInstance(pbrt::syntactic::Object::Instance::SP pbrtInstance)
  {
    Instance::SP ourInstance
      = std::make_shared<Instance>();
    ourInstance->xfm    = (const affine3f&)pbrtInstance->xfm.atStart;
    ourInstance->object = findOrEmitObject(pbrtInstance->object);
    return ourInstance;
  }